

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_pipeline.cpp
# Opt level: O1

string * format_map_abi_cxx11_
                   (string *__return_storage_ptr__,
                   unordered_map<char,_unsigned_long,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                   *map)

{
  ostream *poVar1;
  _Hash_node_base *p_Var2;
  ostringstream oss;
  char local_199;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  p_Var2 = (map->_M_h)._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      local_199 = *(char *)&p_Var2[1]._M_nxt;
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_199,1)
      ;
      local_199 = ':';
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_199,1);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      local_199 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_199,1);
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string format_map(const std::unordered_map<char, size_t>& map) {
  std::ostringstream oss;
  for(const auto& [i, j] : map) {
    oss << i << ':' << j << ' ';
  }
  return oss.str();
}